

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.h
# Opt level: O2

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::TPZSkylNSymMatrix
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZSkylNSymMatrix<std::complex<float>_> *A)

{
  int64_t iVar1;
  char cVar2;
  
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBaseMatrix_016a2660;
  iVar1 = (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow =
       (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = iVar1;
  cVar2 = (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDefPositive = cVar2;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZSkylNSymMatrix_016a0ee8;
  (this->fElem)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0168a9c8;
  (this->fElem).fNAlloc = 0;
  (this->fElem).fStore = (complex<float> **)0x0;
  (this->fElem).fNElements = 0;
  (this->fElemb)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0168a9c8;
  (this->fElemb).fStore = (complex<float> **)0x0;
  (this->fElemb).fNElements = 0;
  (this->fElemb).fNAlloc = 0;
  (this->fStorage).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016505e0;
  (this->fStorage).fExtAlloc[0]._M_value = 0;
  (this->fStorage).fExtAlloc[1]._M_value = 0;
  (this->fStorage).fExtAlloc[2]._M_value = 0;
  (this->fStorage).fExtAlloc[3]._M_value = 0;
  (this->fStorage).fExtAlloc[4]._M_value = 0;
  (this->fStorage).fExtAlloc[5]._M_value = 0;
  (this->fStorage).fExtAlloc[6]._M_value = 0;
  (this->fStorage).fExtAlloc[7]._M_value = 0;
  (this->fStorage).fExtAlloc[8]._M_value = 0;
  (this->fStorage).fExtAlloc[9]._M_value = 0;
  (this->fStorage).super_TPZVec<std::complex<float>_>.fStore = (this->fStorage).fExtAlloc;
  (this->fStorage).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fStorage).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  (this->fStorageb).super_TPZVec<std::complex<float>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016505e0;
  (this->fStorageb).fExtAlloc[8]._M_value = 0;
  (this->fStorageb).fExtAlloc[9]._M_value = 0;
  (this->fStorageb).fExtAlloc[6]._M_value = 0;
  (this->fStorageb).fExtAlloc[7]._M_value = 0;
  (this->fStorageb).fExtAlloc[4]._M_value = 0;
  (this->fStorageb).fExtAlloc[5]._M_value = 0;
  (this->fStorageb).fExtAlloc[2]._M_value = 0;
  (this->fStorageb).fExtAlloc[3]._M_value = 0;
  (this->fStorageb).fExtAlloc[0]._M_value = 0;
  (this->fStorageb).fExtAlloc[1]._M_value = 0;
  (this->fStorageb).super_TPZVec<std::complex<float>_>.fStore = (this->fStorageb).fExtAlloc;
  (this->fStorageb).super_TPZVec<std::complex<float>_>.fNElements = 0;
  (this->fStorageb).super_TPZVec<std::complex<float>_>.fNAlloc = 0;
  Copy(this,A);
  return;
}

Assistant:

TPZSkylNSymMatrix(const TPZSkylNSymMatrix &A ) : 
    TPZRegisterClassId(&TPZSkylNSymMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fElemb(0), fStorage(0), fStorageb(0)  
    { 
        Copy(A); 
    }